

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O1

ValidatorKeys *
jbcoin::ValidatorKeys::make_ValidatorKeys(ValidatorKeys *__return_storage_ptr__,path *keyFile)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  UInt tokenSequence;
  int iVar4;
  Value *pVVar5;
  runtime_error *prVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  Value jKeys;
  optional<jbcoin::SecretKey> secret;
  KeyType keyType;
  Reader reader;
  ifstream ifsKeys;
  string local_3e8;
  Value local_3c8;
  undefined1 local_3b8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  KeyType local_324;
  Reader local_320;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(keyFile->m_pathname)._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_320,
                   "Failed to open key file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
    std::runtime_error::runtime_error(prVar6,(string *)&local_320);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Json::Reader::Reader(&local_320);
  Json::Value::Value(&local_3c8,nullValue);
  bVar3 = Json::Reader::parse(&local_320,(istream *)local_238,&local_3c8);
  if (!bVar3) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                   "Unable to parse json key file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile);
    std::runtime_error::runtime_error(prVar6,(string *)local_3b8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)keyFile;
  if (make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&make_ValidatorKeys(boost::filesystem::path_const&)::
                                 requiredFields_abi_cxx11_);
    if (iVar4 != 0) {
      make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_._M_elems[0].
      _M_dataplus._M_p =
           (pointer)&make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                     _M_elems[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_,
                 "key_type","");
      make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_._M_elems[1].
      _M_dataplus._M_p =
           (pointer)&make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                     _M_elems[1].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                  _M_elems + 1),"secret_key","");
      make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_._M_elems[2].
      _M_dataplus._M_p =
           (pointer)&make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                     _M_elems[2].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                  _M_elems + 2),"token_sequence","");
      make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_._M_elems[3].
      _M_dataplus._M_p =
           (pointer)&make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                     _M_elems[3].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 (make_ValidatorKeys(boost::filesystem::path_const&)::requiredFields_abi_cxx11_.
                  _M_elems + 3),"revoked","");
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                   ::~array,&make_ValidatorKeys(boost::filesystem::path_const&)::
                             requiredFields_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&make_ValidatorKeys(boost::filesystem::path_const&)::
                           requiredFields_abi_cxx11_);
    }
  }
  pcVar1 = local_3b8 + 0x10;
  lVar9 = 0;
  do {
    lVar2 = *(long *)((long)&make_ValidatorKeys(boost::filesystem::path_const&)::
                             requiredFields_abi_cxx11_._M_elems[0]._M_dataplus._M_p + lVar9);
    local_3b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3b8,lVar2,
               *(long *)((long)&make_ValidatorKeys(boost::filesystem::path_const&)::
                                requiredFields_abi_cxx11_._M_elems[0]._M_string_length + lVar9) +
               lVar2);
    bVar3 = Json::Value::isMember(&local_3c8,(string *)local_3b8);
    if (!bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_348,"Key file \'",local_370);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_368._M_dataplus._M_p = (pointer)*plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_368._M_dataplus._M_p == psVar8) {
        local_368.field_2._M_allocated_capacity = *psVar8;
        local_368.field_2._8_8_ = plVar7[3];
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      }
      else {
        local_368.field_2._M_allocated_capacity = *psVar8;
      }
      local_368._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::operator+(&local_390,&local_368,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8)
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_390);
      local_3e8._M_dataplus._M_p = (pointer)*plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_3e8._M_dataplus._M_p == psVar8) {
        local_3e8.field_2._M_allocated_capacity = *psVar8;
        local_3e8.field_2._8_8_ = plVar7[3];
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      }
      else {
        local_3e8.field_2._M_allocated_capacity = *psVar8;
      }
      local_3e8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)&local_3e8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((pointer)local_3b8._0_8_ != pcVar1) {
      operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
    }
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x80);
  pVVar5 = Json::Value::operator[](&local_3c8,"key_type");
  Json::Value::asString_abi_cxx11_((string *)local_3b8,pVVar5);
  local_324 = keyTypeFromString((string *)local_3b8);
  if ((pointer)local_3b8._0_8_ != pcVar1) {
    operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
  }
  if (local_324 != invalid) {
    pVVar5 = Json::Value::operator[](&local_3c8,"secret_key");
    Json::Value::asString_abi_cxx11_(&local_3e8,pVVar5);
    parseBase58<jbcoin::SecretKey>
              ((optional<jbcoin::SecretKey> *)local_3b8,TOKEN_NODE_PRIVATE,&local_3e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if (local_3b8[0] == (string)0x0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_368,"Key file \'",local_370);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_368);
      local_390._M_dataplus._M_p = (pointer)*plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_390._M_dataplus._M_p == psVar8) {
        local_390.field_2._M_allocated_capacity = *psVar8;
        local_390.field_2._8_8_ = plVar7[3];
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      }
      else {
        local_390.field_2._M_allocated_capacity = *psVar8;
      }
      local_390._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      pVVar5 = Json::Value::operator[](&local_3c8,"secret_key");
      Json::Value::toStyledString_abi_cxx11_(&local_348,pVVar5);
      std::operator+(&local_3e8,&local_390,&local_348);
      std::runtime_error::runtime_error(prVar6,(string *)&local_3e8);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVVar5 = Json::Value::operator[](&local_3c8,"token_sequence");
    bVar3 = Json::Value::isIntegral(pVVar5);
    if (!bVar3) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVVar5 = Json::Value::operator[](&local_3c8,"token_sequence");
    tokenSequence = Json::Value::asUInt(pVVar5);
    pVVar5 = Json::Value::operator[](&local_3c8,"revoked");
    bVar3 = Json::Value::isBool(pVVar5);
    if (bVar3) {
      if (local_3b8[0] != (string)0x0) {
        pVVar5 = Json::Value::operator[](&local_3c8,"revoked");
        bVar3 = Json::Value::asBool(pVVar5);
        ValidatorKeys(__return_storage_ptr__,&local_324,(SecretKey *)(local_3b8 + 1),tokenSequence,
                      bVar3);
        if (local_3b8[0] == (string)0x1) {
          SecretKey::~SecretKey((SecretKey *)(local_3b8 + 1));
          local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
        }
        Json::Value::~Value(&local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.document_._M_dataplus._M_p != &local_320.document_.field_2) {
          operator_delete(local_320.document_._M_dataplus._M_p,
                          local_320.document_.field_2._M_allocated_capacity + 1);
        }
        std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                  (&local_320.errors_);
        std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                  ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_320);
        std::ifstream::~ifstream(local_238);
        return __return_storage_ptr__;
      }
      __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bb,
                    "reference_const_type boost::optional<jbcoin::SecretKey>::get() const [T = jbcoin::SecretKey]"
                   );
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_368,"Key file \'",local_370);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_368);
    local_390._M_dataplus._M_p = (pointer)*plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_390._M_dataplus._M_p == psVar8) {
      local_390.field_2._M_allocated_capacity = *psVar8;
      local_390.field_2._8_8_ = plVar7[3];
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    }
    else {
      local_390.field_2._M_allocated_capacity = *psVar8;
    }
    local_390._M_string_length = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pVVar5 = Json::Value::operator[](&local_3c8,"revoked");
    Json::Value::toStyledString_abi_cxx11_(&local_348,pVVar5);
    std::operator+(&local_3e8,&local_390,&local_348);
    std::runtime_error::runtime_error(prVar6,(string *)&local_3e8);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_390,"Key file \'",local_370);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_390);
  local_3e8._M_dataplus._M_p = (pointer)*plVar7;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_3e8._M_dataplus._M_p == psVar8) {
    local_3e8.field_2._M_allocated_capacity = *psVar8;
    local_3e8.field_2._8_8_ = plVar7[3];
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  }
  else {
    local_3e8.field_2._M_allocated_capacity = *psVar8;
  }
  local_3e8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  pVVar5 = Json::Value::operator[](&local_3c8,"key_type");
  Json::Value::toStyledString_abi_cxx11_(&local_368,pVVar5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                 &local_3e8,&local_368);
  std::runtime_error::runtime_error(prVar6,(string *)local_3b8);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ValidatorKeys
ValidatorKeys::make_ValidatorKeys (
    boost::filesystem::path const& keyFile)
{
    std::ifstream ifsKeys (keyFile.c_str (), std::ios::in);

    if (! ifsKeys)
        throw std::runtime_error (
            "Failed to open key file: " + keyFile.string());

    Json::Reader reader;
    Json::Value jKeys;
    if (! reader.parse (ifsKeys, jKeys))
    {
        throw std::runtime_error (
            "Unable to parse json key file: " + keyFile.string());
    }

    static std::array<std::string, 4> const requiredFields {{
        "key_type",
        "secret_key",
        "token_sequence",
        "revoked"
    }};

    for (auto field : requiredFields)
    {
        if (! jKeys.isMember(field))
        {
            throw std::runtime_error (
                "Key file '" + keyFile.string() +
                "' is missing \"" + field + "\" field");
        }
    }

    auto const keyType = keyTypeFromString (jKeys["key_type"].asString());
    if (keyType == KeyType::invalid)
    {
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"key_type\" field: " +
            jKeys["key_type"].toStyledString());
    }

    auto const secret = parseBase58<SecretKey> (
        TokenType::TOKEN_NODE_PRIVATE, jKeys["secret_key"].asString());

    if (! secret)
    {
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"secret_key\" field: " +
            jKeys["secret_key"].toStyledString());
    }

    std::uint32_t tokenSequence;
    try {
        if (! jKeys["token_sequence"].isIntegral())
            throw std::runtime_error ("");

        tokenSequence = jKeys["token_sequence"].asUInt();
    }
    catch (std::runtime_error&)
    {
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"token_sequence\" field: " +
            jKeys["token_sequence"].toStyledString());
    }

    if (! jKeys["revoked"].isBool())
        throw std::runtime_error (
            "Key file '" + keyFile.string() +
            "' contains invalid \"revoked\" field: " +
            jKeys["revoked"].toStyledString());

    return ValidatorKeys (
        keyType, *secret, tokenSequence, jKeys["revoked"].asBool());
}